

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O3

TermList __thiscall Kernel::FormulaTransformer::apply(FormulaTransformer *this,TermList ts)

{
  uint uVar1;
  TermList TVar2;
  Formula *formula;
  ulong uVar3;
  NotImplementedException *this_00;
  ulong uVar4;
  uint64_t *puVar5;
  long lVar6;
  DArray<Kernel::TermList> terms;
  Stack<Kernel::TermList> local_58;
  
  if ((ts._content & 1) == 0) {
    if (*(uint *)(ts._content + 8) < 0xfffffff9) {
      if ((*(byte *)(ts._content + 0x28) & 8) == 0) {
        local_58._cursor = (TermList *)0x0;
        local_58._end = (TermList *)0x0;
        local_58._capacity = 0;
        local_58._stack = (TermList *)0x0;
        uVar1 = *(uint *)(ts._content + 0xc) & 0xfffffff;
        TVar2._content = *(uint64_t *)(ts._content + 0x28 + (ulong)uVar1 * 8);
        if (((uint)TVar2._content & 3) != 2) {
          puVar5 = (uint64_t *)(ts._content + (ulong)uVar1 * 8 + 0x20);
          do {
            TVar2 = apply(this,TVar2);
            if (local_58._cursor == local_58._end) {
              Lib::Stack<Kernel::TermList>::expand(&local_58);
            }
            (local_58._cursor)->_content = TVar2._content;
            local_58._cursor = local_58._cursor + 1;
            TVar2._content = *puVar5;
            puVar5 = puVar5 + -1;
          } while (((uint)TVar2._content & 3) != 2);
        }
        ts._content = (uint64_t)Term::create(ts._content,local_58._stack);
        if (local_58._stack != (TermList *)0x0) {
          uVar3 = local_58._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar3 == 0) {
            (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._stack;
          }
          else if (uVar3 < 0x11) {
            (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._stack;
          }
          else if (uVar3 < 0x19) {
            (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._stack;
          }
          else if (uVar3 < 0x21) {
            (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._stack;
          }
          else if (uVar3 < 0x31) {
            (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._stack;
          }
          else if (uVar3 < 0x41) {
            (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._stack;
          }
          else {
            operator_delete(local_58._stack,0x10);
          }
        }
      }
    }
    else {
      switch(*(uint *)(ts._content + 8)) {
      case 0xfffffff9:
        Lib::DArray<Kernel::TermList>::DArray
                  ((DArray<Kernel::TermList> *)&local_58,
                   (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff));
        uVar1 = *(uint *)(ts._content + 0xc) & 0xfffffff;
        uVar3 = (ulong)uVar1;
        if (uVar1 != 0) {
          lVar6 = 0;
          uVar4 = 0;
          do {
            TVar2 = apply(this,*(uint64_t *)(ts._content + 0x28 + (uVar3 + lVar6) * 8));
            local_58._cursor[uVar4]._content = TVar2._content;
            uVar4 = uVar4 + 1;
            uVar3 = (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff);
            lVar6 = lVar6 + -1;
          } while (uVar4 < uVar3);
        }
        TVar2._content =
             (*(code *)(&DAT_008f5a68 +
                       *(int *)(&DAT_008f5a68 + (ulong)~*(uint *)(ts._content + 8) * 4)))();
        return (TermList)TVar2._content;
      case 0xfffffffa:
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x38);
        Lib::NotImplementedException::NotImplementedException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/FormulaTransformer.cpp"
                   ,0x7d);
        __cxa_throw(this_00,&Lib::NotImplementedException::typeinfo,Lib::Exception::~Exception);
      case 0xfffffffb:
        apply(this,(TermList)*(uint64_t *)(ts._content - 0x18));
        apply(this,(TermList)
                   *(uint64_t *)
                    (ts._content + 0x28 + (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8));
        TVar2._content =
             (*(code *)(&DAT_008f5a84 +
                       *(int *)(&DAT_008f5a84 + (ulong)~*(uint *)(ts._content + 8) * 4)))();
        return (TermList)TVar2._content;
      case 0xfffffffc:
        TVar2 = apply(this,*(uint64_t *)(ts._content - 0x28));
        ts._content = (uint64_t)Term::createTuple(TVar2._content);
        break;
      case 0xfffffffd:
        formula = apply(this,*(Formula **)(ts._content - 0x28));
        ts._content = (uint64_t)Term::createFormula(formula);
        break;
      case 0xfffffffe:
        apply(this,(TermList)*(uint64_t *)(ts._content - 0x18));
        apply(this,(TermList)
                   *(uint64_t *)
                    (ts._content + 0x28 + (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8));
        TVar2._content =
             (*(code *)(&DAT_008f5aa0 +
                       *(int *)(&DAT_008f5aa0 + (ulong)~*(uint *)(ts._content + 8) * 4)))();
        return (TermList)TVar2._content;
      case 0xffffffff:
        apply(this,*(Formula **)(ts._content - 0x28));
        apply(this,(TermList)
                   *(uint64_t *)
                    (ts._content + 0x28 + (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8));
        apply(this,(TermList)
                   *(uint64_t *)
                    (ts._content + 0x20 + (ulong)(*(uint *)(ts._content + 0xc) & 0xfffffff) * 8));
        TVar2._content =
             (*(code *)(&DAT_008f5abc +
                       *(int *)(&DAT_008f5abc + (ulong)~*(uint *)(ts._content + 8) * 4)))();
        return (TermList)TVar2._content;
      }
    }
  }
  return (TermList)ts._content;
}

Assistant:

TermList FormulaTransformer::apply(TermList ts) {
  if (ts.isVar()) {
    return ts;
  }

  Term* term = ts.term();

  if (term->isSpecial()) {
    Term::SpecialTermData *sd = ts.term()->getSpecialData();
    switch (sd->specialFunctor()) {
      case SpecialFunctor::ITE:
        return TermList(Term::createITE(apply(sd->getCondition()),
                                        apply(*term->nthArgument(0)),
                                        apply(*term->nthArgument(1)),
                                        sd->getSort()));

      case SpecialFunctor::FORMULA:
        return TermList(Term::createFormula(apply(sd->getFormula())));

      case SpecialFunctor::LET:
        return TermList(Term::createLet(sd->getFunctor(),
                                        sd->getVariables(),
                                        apply(sd->getBinding()),
                                        apply(*term->nthArgument(0)),
                                        sd->getSort()));

      case SpecialFunctor::LET_TUPLE:
        return TermList(Term::createTupleLet(sd->getFunctor(),
                                             sd->getTupleSymbols(),
                                             apply(sd->getBinding()),
                                             apply(*term->nthArgument(0)),
                                             sd->getSort()));

      case SpecialFunctor::TUPLE:
        return TermList(Term::createTuple(apply(TermList(sd->getTupleTerm())).term()));

      case SpecialFunctor::LAMBDA:
        NOT_IMPLEMENTED;
      case SpecialFunctor::MATCH: {
        DArray<TermList> terms(term->arity());
        for (unsigned i = 0; i < term->arity(); i++) {
          terms[i] = apply(*term->nthArgument(i));
        }
        return TermList(Term::createMatch(sd->getSort(), sd->getMatchedSort(), term->arity(), terms.begin()));
      }

    }
    ASSERTION_VIOLATION_REP(ts.toString());
  }

  if (term->shared()) {
    return ts;
  }

  Stack<TermList> args;
  Term::Iterator terms(term);
  while (terms.hasNext()) {
    args.push(apply(terms.next()));
  }

  return TermList(Term::create(term, args.begin()));
}